

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int ARGBRect(uint8_t *dst_argb,int dst_stride_argb,int dst_x,int dst_y,int width,int height,
            uint32_t value)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  code *pcVar6;
  int iVar7;
  bool bVar8;
  
  iVar3 = -1;
  if ((((-1 < (dst_y | dst_x)) && (dst_argb != (uint8_t *)0x0)) && (0 < width)) && (height != 0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    bVar8 = dst_stride_argb != width * 4;
    iVar5 = 0;
    if (bVar8) {
      iVar5 = dst_stride_argb;
    }
    iVar7 = 1;
    if (!bVar8) {
      iVar7 = iVar1;
    }
    if (!bVar8) {
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((uVar2 & 0x10) == 0) {
      pcVar6 = ARGBSetRow_C;
    }
    else {
      pcVar6 = ARGBSetRow_X86;
    }
    iVar3 = 0;
    if (0 < iVar1) {
      puVar4 = dst_argb + (dst_stride_argb * dst_y + dst_x * 4);
      do {
        (*pcVar6)(puVar4,value,iVar7 * width);
        puVar4 = puVar4 + iVar5;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

LIBYUV_API
int ARGBRect(uint8_t* dst_argb,
             int dst_stride_argb,
             int dst_x,
             int dst_y,
             int width,
             int height,
             uint32_t value) {
  int y;
  void (*ARGBSetRow)(uint8_t * dst_argb, uint32_t value, int width) =
      ARGBSetRow_C;
  if (!dst_argb || width <= 0 || height == 0 || dst_x < 0 || dst_y < 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  dst_argb += dst_y * dst_stride_argb + dst_x * 4;
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }

#if defined(HAS_ARGBSETROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBSetRow = ARGBSetRow_Any_NEON;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBSETROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    ARGBSetRow = ARGBSetRow_X86;
  }
#endif
#if defined(HAS_ARGBSETROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBSetRow = ARGBSetRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBSETROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBSetRow = ARGBSetRow_Any_MSA;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_MSA;
    }
  }
#endif

  // Set plane
  for (y = 0; y < height; ++y) {
    ARGBSetRow(dst_argb, value, width);
    dst_argb += dst_stride_argb;
  }
  return 0;
}